

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cppjit.cpp
# Opt level: O2

void test_function_traits::test_all_arguments_function(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "testing function traits all arguments member, function version (compile-time check)"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void test_all_arguments_function() {
  std::cout << "testing function traits all arguments member, function version "
               "(compile-time check)"
            << std::endl;
  static_assert(
      std::is_same<cppjit::detail::function_traits<decltype(
                       function_to_analyse::f)>::args_type,
                   cppjit::detail::pack<int, int, double>>::value,
      "function_traits pack instantiated with all arguments not created");
}